

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O3

lzma_ret lzma_block_header_size(lzma_block *block)

{
  long *plVar1;
  lzma_vli vli;
  uint32_t uVar2;
  lzma_ret lVar3;
  undefined8 in_RAX;
  lzma_filter *filter;
  long lVar4;
  long lVar5;
  int iVar6;
  uint32_t add;
  undefined8 uStack_38;
  
  lVar3 = LZMA_OPTIONS_ERROR;
  if (block->version < 2) {
    vli = block->compressed_size;
    uStack_38 = in_RAX;
    if (vli == 0xffffffffffffffff) {
      iVar6 = 6;
    }
    else {
      uVar2 = lzma_vli_size(vli);
      iVar6 = 6;
      if (vli != 0) {
        iVar6 = uVar2 + 6;
      }
      if (vli == 0 || uVar2 == 0) {
        return LZMA_PROG_ERROR;
      }
    }
    if (block->uncompressed_size != 0xffffffffffffffff) {
      uVar2 = lzma_vli_size(block->uncompressed_size);
      if (uVar2 == 0) {
        return LZMA_PROG_ERROR;
      }
      iVar6 = iVar6 + uVar2;
    }
    filter = block->filters;
    lVar3 = LZMA_PROG_ERROR;
    if ((filter != (lzma_filter *)0x0) && (filter->id != 0xffffffffffffffff)) {
      lVar4 = 0;
      lVar5 = 0x10;
      do {
        if (lVar5 + 0x10 == 0x60) {
          return LZMA_PROG_ERROR;
        }
        lVar3 = lzma_filter_flags_size((uint32_t *)((long)&uStack_38 + 4),filter);
        if (lVar3 != LZMA_OK) {
          return lVar3;
        }
        lVar4 = lVar4 + 1;
        iVar6 = iVar6 + uStack_38._4_4_;
        filter = block->filters + lVar4;
        plVar1 = (long *)((long)&block->filters->id + lVar5);
        lVar5 = lVar5 + 0x10;
      } while (*plVar1 != -1);
      block->header_size = iVar6 + 3U & 0xfffffffc;
      lVar3 = LZMA_OK;
    }
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_size(lzma_block *block)
{
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	// Block Header Size + Block Flags + CRC32.
	uint32_t size = 1 + 1 + 4;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->compressed_size);
		if (add == 0 || block->compressed_size == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->uncompressed_size);
		if (add == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// List of Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	for (size_t i = 0; block->filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		// Don't allow too many filters.
		if (i == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		uint32_t add;
		return_if_error(lzma_filter_flags_size(&add,
				block->filters + i));

		size += add;
	}

	// Pad to a multiple of four bytes.
	block->header_size = (size + 3) & ~UINT32_C(3);

	// NOTE: We don't verify that the encoded size of the Block stays
	// within limits. This is because it is possible that we are called
	// with exaggerated Compressed Size (e.g. LZMA_VLI_MAX) to reserve
	// space for Block Header, and later called again with lower,
	// real values.

	return LZMA_OK;
}